

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-socket.c
# Opt level: O0

void * get_buffer(lua_State *L,int index,int *sz)

{
  int iVar1;
  lua_Integer lVar2;
  char *__src;
  char *str;
  size_t len;
  void *buffer;
  int *sz_local;
  lua_State *plStack_10;
  int index_local;
  lua_State *L_local;
  
  buffer = sz;
  sz_local._4_4_ = index;
  plStack_10 = L;
  iVar1 = lua_isuserdata(L,index);
  if (iVar1 == 0) {
    str = (char *)0x0;
    __src = luaL_checklstring(plStack_10,sz_local._4_4_,(size_t *)&str);
    len = (size_t)malloc((size_t)str);
    memcpy((void *)len,__src,(size_t)str);
    *(int *)buffer = (int)str;
  }
  else {
    len = (size_t)lua_touserdata(plStack_10,sz_local._4_4_);
    lVar2 = luaL_checkinteger(plStack_10,sz_local._4_4_ + 1);
    *(int *)buffer = (int)lVar2;
  }
  return (void *)len;
}

Assistant:

static void *
get_buffer(lua_State *L, int index, int *sz) {
	void *buffer;
	if (lua_isuserdata(L,index)) {
		buffer = lua_touserdata(L,index);
		*sz = luaL_checkinteger(L,index+1);
	} else {
		size_t len = 0;
		const char * str =  luaL_checklstring(L, index, &len);
		buffer = skynet_malloc(len);
		memcpy(buffer, str, len);
		*sz = (int)len;
	}
	return buffer;
}